

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

opStatus __thiscall llvm::APFloat::multiply(APFloat *this,APFloat *RHS,roundingMode RM)

{
  bool bVar1;
  fltSemantics *pfVar2;
  fltSemantics *pfVar3;
  roundingMode RM_local;
  APFloat *RHS_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  pfVar3 = getSemantics(RHS);
  if (pfVar2 != pfVar3) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only call on two APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3c1,"opStatus llvm::APFloat::multiply(const APFloat &, roundingMode)");
  }
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    this_local._4_4_ = detail::IEEEFloat::multiply(&(this->U).IEEE,&(RHS->U).IEEE,RM);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x3c6);
    }
    this_local._4_4_ =
         detail::DoubleAPFloat::multiply
                   ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(RHS->U).IEEE,RM);
  }
  return this_local._4_4_;
}

Assistant:

opStatus multiply(const APFloat &RHS, roundingMode RM) {
    assert(&getSemantics() == &RHS.getSemantics() &&
           "Should only call on two APFloats with the same semantics");
    if (usesLayout<IEEEFloat>(getSemantics()))
      return U.IEEE.multiply(RHS.U.IEEE, RM);
    if (usesLayout<DoubleAPFloat>(getSemantics()))
      return U.Double.multiply(RHS.U.Double, RM);
    llvm_unreachable("Unexpected semantics");
  }